

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CompactRepeatedFieldPrinter_Test::TestBody
          (TextFormatTest_CompactRepeatedFieldPrinter_Test *this)

{
  RepeatedPtrFieldBase *this_00;
  bool bVar1;
  FieldDescriptor *field;
  FastFieldValuePrinter *this_01;
  void *pvVar2;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  pointer message_00;
  char *in_R9;
  pointer *__ptr_2;
  Metadata MVar3;
  string text;
  TestAllTypes message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_428;
  AssertHelper local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  undefined1 local_410 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  AssertHelper local_3f0;
  undefined1 local_3e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  Printer local_3c8;
  undefined1 local_358 [16];
  undefined1 local_348 [816];
  
  TextFormat::Printer::Printer(&local_3c8);
  MVar3 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  field = Descriptor::FindFieldByNumber(MVar3.descriptor,0x30);
  this_01 = (FastFieldValuePrinter *)operator_new(8);
  TextFormat::FastFieldValuePrinter::FastFieldValuePrinter(this_01);
  this_01->_vptr_FastFieldValuePrinter = (_func_int **)&PTR__FastFieldValuePrinter_018c03c8;
  bVar1 = TextFormat::Printer::RegisterFieldValuePrinter(&local_3c8,field,this_01);
  local_3e8[0] = bVar1;
  local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)local_3e8,
               (AssertionResult *)
               "printer.RegisterFieldValuePrinter( unittest::TestAllTypes::default_instance() .descriptor() ->FindFieldByNumber( unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber), new CompactRepeatedFieldPrinter)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x373,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_420,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    if ((undefined1 *)local_358._0_8_ != local_348) {
      operator_delete((void *)local_358._0_8_,local_348._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_410._1_7_,local_410[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_410._1_7_,local_410[0]) + 8))();
    }
    if (local_3e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3e0,local_3e0);
    }
    goto LAB_009684a5;
  }
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_358,(Arena *)0x0);
  this_00 = (RepeatedPtrFieldBase *)(local_348 + 0x128);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 2;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 3;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3d8._M_local_buf[0] = '\0';
  local_3e8 = (undefined1  [8])&local_3d8;
  local_420.data_._0_1_ =
       (internal)
       TextFormat::Printer::PrintToString(&local_3c8,(Message *)local_358,(string *)local_3e8);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_420.data_._0_1_) {
    testing::internal::CmpHelperEQ<char[53],std::__cxx11::string>
              ((internal *)local_410,
               "\"repeated_nested_message {\\n\" \"  bb: 1\\n\" \"  bb: 2\\n\" \"  bb: 3\\n\" \"}\\n\""
               ,"text",(char (*) [53])"repeated_nested_message {\n  bb: 1\n  bb: 2\n  bb: 3\n}\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8);
    if (local_410[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_420);
      if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message_00 = anon_var_dwarf_a22956 + 5;
      }
      else {
        message_00 = (local_408->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
                 ,0x382,message_00);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_428,(Message *)&local_420);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
      if ((long *)CONCAT71(local_420.data_._1_7_,local_420.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_420.data_._1_7_,local_420.data_._0_1_) + 8))();
      }
    }
    if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_408;
LAB_0096847c:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_02,local_408);
    }
  }
  else {
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_418;
    testing::Message::Message((Message *)&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_410,(internal *)&local_420,
               (AssertionResult *)"printer.PrintToString(message, &text)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x37b,(char *)CONCAT71(local_410._1_7_,local_410[0]));
    testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_410._1_7_,local_410[0]) != &local_400) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_410._1_7_,local_410[0]),local_400._M_allocated_capacity + 1)
      ;
    }
    if (local_428._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_428._M_head_impl + 8))();
    }
    local_408 = local_418;
    if (local_418 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0096847c;
  }
  if (local_3e8 != (undefined1  [8])&local_3d8) {
    operator_delete((void *)local_3e8,
                    CONCAT71(local_3d8._M_allocated_capacity._1_7_,local_3d8._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_358);
LAB_009684a5:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                     *)&local_3c8.custom_message_printers_);
  local_3c8.custom_message_printers_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                     *)&local_3c8.custom_printers_);
  local_3c8.custom_printers_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  if ((tuple<const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
       )local_3c8.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_3c8.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl)[1])();
  }
  return;
}

Assistant:

TEST_F(TextFormatTest, CompactRepeatedFieldPrinter) {
  TextFormat::Printer printer;
  ASSERT_TRUE(printer.RegisterFieldValuePrinter(
      unittest::TestAllTypes::default_instance()
          .descriptor()
          ->FindFieldByNumber(
              unittest::TestAllTypes::kRepeatedNestedMessageFieldNumber),
      new CompactRepeatedFieldPrinter));

  proto2_unittest::TestAllTypes message;
  message.add_repeated_nested_message()->set_bb(1);
  message.add_repeated_nested_message()->set_bb(2);
  message.add_repeated_nested_message()->set_bb(3);

  std::string text;
  ASSERT_TRUE(printer.PrintToString(message, &text));
  EXPECT_EQ(
      "repeated_nested_message {\n"
      "  bb: 1\n"
      "  bb: 2\n"
      "  bb: 3\n"
      "}\n",
      text);
}